

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::flatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (jsonpath *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value)

{
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar1;
  string_type parent_key;
  string_type local_30;
  
  *(undefined2 *)this = 4;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30.field_2._M_allocated_capacity._0_2_ = 0x24;
  local_30._M_string_length = 1;
  flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (&local_30,value,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1.field_0.int64_.val_ = extraout_RDX;
  bVar1.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar1.field_0;
}

Assistant:

Json flatten(const Json& value)
    {
        Json result;
        typename Json::string_type parent_key = {'$'};
        flatten_(parent_key, value, result);
        return result;
    }